

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::jls_codec(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
            *this,default_traits<unsigned_short,_charls::triplet<unsigned_short>_> traits,
           frame_info *frame_info,coding_parameters *parameters)

{
  ulong uVar1;
  undefined8 uVar2;
  uint __line;
  uint32_t uVar3;
  uint32_t uVar4;
  interleave_mode iVar5;
  color_transformation cVar6;
  undefined3 uVar7;
  default_traits<unsigned_short,_charls::triplet<unsigned_short>_> dVar8;
  ulong uVar9;
  char *__assertion;
  
  dVar8 = traits;
  uVar1._0_4_ = frame_info->bits_per_sample;
  uVar1._4_4_ = frame_info->component_count;
  uVar3 = frame_info->width;
  uVar4 = frame_info->height;
  uVar9 = uVar1 & 0xffffffff | 0x100000000;
  if (parameters->interleave_mode != None) {
    uVar9 = uVar1;
  }
  (this->super_decoder_strategy)._vptr_decoder_strategy =
       (_func_int **)&PTR__decoder_strategy_0013d338;
  (this->super_decoder_strategy).frame_info_.width = uVar3;
  (this->super_decoder_strategy).frame_info_.height = uVar4;
  (this->super_decoder_strategy).frame_info_.bits_per_sample = (int)uVar9;
  (this->super_decoder_strategy).frame_info_.component_count = (int)(uVar9 >> 0x20);
  uVar3 = parameters->restart_interval;
  iVar5 = parameters->interleave_mode;
  cVar6 = parameters->transformation;
  (this->super_decoder_strategy).parameters_.near_lossless = parameters->near_lossless;
  (this->super_decoder_strategy).parameters_.restart_interval = uVar3;
  (this->super_decoder_strategy).parameters_.interleave_mode = iVar5;
  (this->super_decoder_strategy).parameters_.transformation = cVar6;
  uVar7 = *(undefined3 *)&parameters->field_0x11;
  (this->super_decoder_strategy).parameters_.output_bgr = parameters->output_bgr;
  *(undefined3 *)&(this->super_decoder_strategy).parameters_.field_0x11 = uVar7;
  (this->super_decoder_strategy).process_line_._M_t.
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl = (process_line *)0x0;
  (this->super_decoder_strategy).read_cache_ = 0;
  (this->super_decoder_strategy).valid_bits_ = 0;
  (this->super_decoder_strategy).position_ = (uint8_t *)0x0;
  (this->super_decoder_strategy).end_position_ = (uint8_t *)0x0;
  (this->super_decoder_strategy).position_ff_ = (uint8_t *)0x0;
  (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)&PTR__jls_codec_0013d8d0;
  uVar2 = traits._8_8_;
  (this->traits_).maximum_sample_value = traits.maximum_sample_value;
  (this->traits_).near_lossless = traits.near_lossless;
  (this->traits_).range = (int)uVar2;
  (this->traits_).quantized_bits_per_pixel = (int)((ulong)uVar2 >> 0x20);
  (this->traits_).quantized_bits_per_pixel = (int)dVar8._12_8_;
  (this->traits_).bits_per_pixel = (int)((ulong)dVar8._12_8_ >> 0x20);
  (this->traits_).limit = traits.limit;
  (this->traits_).reset_threshold = traits.reset_threshold;
  (this->rect_).X = 0;
  (this->rect_).Y = 0;
  (this->rect_).Width = 0;
  (this->rect_).Height = 0;
  this->width_ = frame_info->width;
  this->restart_interval_ = 0;
  this->restart_interval_counter_ = 0;
  this->t1_ = 0;
  this->t2_ = 0;
  *(undefined8 *)((long)&this->t2_ + 1) = 0;
  std::array<charls::context_regular_mode,_365UL>::array(&this->contexts_);
  std::array<charls::context_run_mode,_2UL>::array(&this->context_run_mode_);
  this->run_index_ = 0;
  this->previous_line_ = (pixel_type *)0x0;
  this->current_line_ = (pixel_type *)0x0;
  this->quantization_ = (int8_t *)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((parameters->interleave_mode == None) &&
     ((this->super_decoder_strategy).frame_info_.component_count != 1)) {
    __assertion = 
    "(parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) || parameters.interleave_mode != interleave_mode::none"
    ;
    __line = 0x6b;
  }
  else {
    if (((this->traits_).maximum_sample_value - 1U < 0xffff) &&
       ((this->traits_).bits_per_pixel - 1U < 0x10)) {
      return;
    }
    __assertion = "traits_.is_valid()";
    __line = 0x6c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,__line,
                "charls::jls_codec<charls::default_traits<unsigned short, charls::triplet<unsigned short>>, charls::decoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::default_traits<unsigned short, charls::triplet<unsigned short>>, Strategy = charls::decoder_strategy]"
               );
}

Assistant:

jls_codec(Traits traits, const frame_info& frame_info, const coding_parameters& parameters) noexcept :
        Strategy{update_component_count(frame_info, parameters), parameters},
        traits_{std::move(traits)},
        width_{frame_info.width}
    {
        ASSERT((parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) ||
               parameters.interleave_mode != interleave_mode::none);
        ASSERT(traits_.is_valid());
    }